

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
local_vehicles(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int x,int y,
              vector<vehicle,_std::allocator<vehicle>_> *vehicles,int same)

{
  pointer pvVar1;
  iterator __position;
  uint in_EAX;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_38 = (ulong)in_EAX;
  iVar2 = 0;
  do {
    if ((iVar2 != same) &&
       (pvVar1 = (vehicles->super__Vector_base<vehicle,_std::allocator<vehicle>_>)._M_impl.
                 super__Vector_impl_data._M_start, iVar4 = pvVar1[iVar2].x - x,
       iVar3 = pvVar1[iVar2].y - y, (uint)(iVar3 * iVar3 + iVar4 * iVar4) < 0x1440)) {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                   (int *)((long)&uStack_38 + 4));
      }
      else {
        *__position._M_current = iVar2;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    iVar3 = uStack_38._4_4_;
    iVar2 = uStack_38._4_4_ + 1;
    uStack_38 = CONCAT44(iVar2,(undefined4)uStack_38);
  } while (iVar3 < 0x18);
  return __return_storage_ptr__;
}

Assistant:

vector<int> local_vehicles(int x, int y, vector<vehicle> vehicles, int same){
	vector<int> local;
	
	for (int i=0;i<numVehicles;i++){
		if (i != same){
			int xdiff = vehicles[i].x-x;
			int ydiff = vehicles[i].y-y;

			if (xdiff*xdiff + ydiff*ydiff <threshold*threshold){
				local.push_back(i);
			}
		}
	}
	return local;
}